

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manufactured_solution.cc
# Opt level: O0

int main(void)

{
  Index *this;
  dim_t *this_00;
  initializer_list<std::pair<const_lf::base::RefEl,_unsigned_int>_> __l;
  RefEl RVar1;
  uint uVar2;
  UniformFEDofHandler *this_01;
  element_type *peVar3;
  __tuple_element_t<0UL,_tuple<COOMatrix<double>,_Matrix<double,__1,_1,_0,__1,_1>_>_> *p_Var4;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pMVar5;
  reference pvVar6;
  element_type *peVar7;
  Scalar *pSVar8;
  ostream *poVar9;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>_>
  MVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  SVar19;
  double DGf_modified;
  double L2f_modified;
  double DG_modified;
  double L2_modified;
  double DGf;
  double L2f;
  double DG;
  double L2;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
  *diff_g_fac_modified;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
  *diff_g_fac;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  diff_v_fac_modified;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  diff_v_fac;
  undefined1 local_f10 [8];
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
  velocity_scaled_modified;
  undefined1 local_ed8 [8];
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
  velocity_scaled;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
  local_ea0;
  PredicateTrue local_e71;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
  local_e70;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  local_e48;
  fe local_e08 [8];
  double local_e00;
  double factor_modified;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
  local_df0;
  PredicateTrue local_dc1;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
  local_dc0;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  local_d98;
  fe local_d58 [8];
  double local_d50;
  double factor;
  undefined1 local_d40 [7];
  anon_class_1_0_00000001 qr_provider;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
  diff_grad_modified;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
  diff_grad;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  diff_v_modified;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  diff_v;
  string local_c98;
  allocator<char> local_c71;
  string local_c70;
  allocator<char> local_c49;
  string local_c48;
  allocator<char> local_c21;
  string local_c20;
  string local_c00;
  shared_ptr<const_lf::mesh::Mesh> local_be0;
  undefined1 local_bd0 [8];
  VtkWriter writer;
  undefined1 local_9e8 [8];
  MeshFunctionVelocity<double,_double> velocity_modified;
  undefined1 local_9b8 [8];
  MeshFunctionVelocity<double,_double> velocity;
  undefined1 local_990 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>
  grad_exact;
  undefined1 local_978 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>
  velocity_exact;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> fe_space;
  size_type lvl_1;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:180:7)>
  analyticF;
  undefined1 local_938 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:176:7)>
  analyticU;
  undefined1 local_918 [8];
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver_modified;
  type *rhs_modified;
  type *A_modified;
  QuadRule local_670;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> local_640;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  local_620;
  tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_600;
  Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_5d0;
  undefined1 local_5c0 [8];
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  type *rhs;
  type *A;
  QuadRule local_318;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> local_2e8;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  local_2c8;
  tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_2a8;
  anon_class_1_0_00000001 local_271;
  anon_class_4_1_54a3980e local_270;
  undefined1 local_26b;
  allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_> local_26a;
  anon_class_1_0_00000001 dirichlet_funct;
  anon_class_4_1_54a3980e f;
  RefEl local_261;
  int local_260;
  RefEl local_259;
  pair<const_lf::base::RefEl,_unsigned_int> local_258;
  pair<const_lf::base::RefEl,_unsigned_int> local_250;
  iterator local_248;
  size_type local_240;
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  local_238;
  shared_ptr<const_lf::mesh::Mesh> local_208;
  shared_ptr<const_lf::assemble::DofHandler> local_1f8;
  reference local_1e8;
  value_type *sol;
  shared_ptr<lf::mesh::Mesh> mesh;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_1b0;
  undefined1 local_1a8 [8];
  GmshReader reader;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_118;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_110;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> factory;
  path local_e8;
  path local_c0;
  path local_98;
  undefined1 local_70 [8];
  path meshpath;
  size_type lvl;
  allocator<ProblemSolution> local_31;
  undefined1 local_30 [8];
  vector<ProblemSolution,_std::allocator<ProblemSolution>_> solutions;
  uint quadrule_degree;
  int n;
  uint mesh_count;
  
  solutions.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
  solutions.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 10;
  std::allocator<ProblemSolution>::allocator(&local_31);
  std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::vector
            ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,6,&local_31);
  std::allocator<ProblemSolution>::~allocator(&local_31);
  meshpath._M_cmpts = (_List)0x0;
  meshpath._33_3_ = 0;
  for (; (uint)meshpath._32_4_ < 6; meshpath._32_4_ = meshpath._32_4_ + 1) {
    std::filesystem::__cxx11::path::path<char[148],std::filesystem::__cxx11::path>
              ((path *)local_70,
               (char (*) [148])
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc"
               ,auto_format);
    std::filesystem::__cxx11::path::parent_path();
    concat<char_const(&)[5],unsigned_int&,char_const(&)[5]>
              ((string *)&factory,(char (*) [5])"disk",(uint *)&meshpath._M_cmpts,
               (char (*) [5])".msh");
    std::filesystem::__cxx11::path::path(&local_e8,(string_type *)&factory,auto_format);
    std::filesystem::__cxx11::operator/(&local_98,&local_c0,&local_e8);
    std::filesystem::__cxx11::path::operator=((path *)local_70,&local_98);
    std::filesystem::__cxx11::path::~path(&local_98);
    std::filesystem::__cxx11::path::~path(&local_e8);
    std::__cxx11::string::~string((string *)&factory);
    std::filesystem::__cxx11::path::~path(&local_c0);
    reader.nr_2_name_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 2;
    std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_118);
    std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
    unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
              ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
               &local_110,&local_118);
    std::
    unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
    ::~unique_ptr(&local_118);
    std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::unique_ptr
              (&local_1b0,&local_110);
    std::filesystem::__cxx11::path::string
              ((string *)
               &mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (path *)local_70);
    lf::io::GmshReader::GmshReader
              ((GmshReader *)local_1a8,&local_1b0,
               (string *)
               &mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
              (&local_1b0);
    lf::io::GmshReader::mesh((GmshReader *)&sol);
    local_1e8 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                          ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                           (ulong)(uint)meshpath._32_4_);
    std::shared_ptr<lf::mesh::Mesh_const>::operator=
              ((shared_ptr<lf::mesh::Mesh_const> *)local_1e8,(shared_ptr<lf::mesh::Mesh> *)&sol);
    this_01 = (UniformFEDofHandler *)operator_new(0xb8);
    local_26b = 1;
    std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
              ((shared_ptr<lf::mesh::Mesh_const> *)&local_208,(shared_ptr<lf::mesh::Mesh> *)&sol);
    local_259 = lf::base::RefEl::kPoint();
    local_260 = 1;
    std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_int,_true>
              (&local_258,&local_259,&local_260);
    local_261 = lf::base::RefEl::kSegment();
    f.n = 1;
    std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_int,_true>
              (&local_250,&local_261,&f.n);
    local_248 = &local_258;
    local_240 = 2;
    std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::allocator(&local_26a);
    __l._M_len = local_240;
    __l._M_array = local_248;
    std::
    map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
    ::map(&local_238,__l,(less<lf::base::RefEl> *)&dirichlet_funct,&local_26a);
    lf::assemble::UniformFEDofHandler::UniformFEDofHandler(this_01,&local_208,&local_238,true);
    local_26b = 0;
    std::shared_ptr<lf::assemble::DofHandler_const>::
    shared_ptr<lf::assemble::UniformFEDofHandler,void>
              ((shared_ptr<lf::assemble::DofHandler_const> *)&local_1f8,this_01);
    std::shared_ptr<const_lf::assemble::DofHandler>::operator=(&local_1e8->dofh,&local_1f8);
    std::shared_ptr<const_lf::assemble::DofHandler>::~shared_ptr(&local_1f8);
    std::
    map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
    ::~map(&local_238);
    std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::~allocator(&local_26a);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_208);
    pvVar6 = local_1e8;
    local_270.n = 3;
    local_271 = (anon_class_1_0_00000001)0x0;
    peVar3 = std::
             __shared_ptr_access<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_1e8->dofh);
    std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>::
    function<main::__0&,void>
              ((function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)> *)
               &local_2c8,&local_270);
    std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>::
    function<main::__1&,void>
              ((function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)> *)&local_2e8,
               &local_271);
    RVar1 = lf::base::RefEl::kTria();
    lf::quad::make_QuadRule(&local_318,RVar1,10);
    projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow
              (&local_2a8,&pvVar6->mesh,peVar3,&local_2c8,&local_2e8,1.0,&local_318,false);
    lf::quad::QuadRule::~QuadRule(&local_318);
    std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)>::~function
              (&local_2e8);
    std::
    function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>::
    ~function(&local_2c8);
    p_Var4 = std::get<0ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>>
                       (&local_2a8);
    pMVar5 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             std::get<1ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>>
                       (&local_2a8);
    lf::assemble::COOMatrix<double>::makeSparse
              ((SparseMatrix<double,_0,_int> *)&solver.m_detPermC,p_Var4);
    Eigen::SparseMatrix<double,_0,_int>::operator=
              (&local_1e8->A,(SparseMatrix<double,_0,_int> *)&solver.m_detPermC);
    Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
              ((SparseMatrix<double,_0,_int> *)&solver.m_detPermC);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              (&local_1e8->rhs,(Matrix<double,__1,_1,_0,__1,_1> *)pMVar5);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               local_5c0);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::compute
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               local_5c0,&local_1e8->A);
    SVar19 = Eigen::
             SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
             ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                         *)local_5c0,pMVar5);
    local_5d0 = SVar19;
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)&local_1e8->solution,
               (DenseBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_5d0);
    pvVar6 = local_1e8;
    peVar3 = std::
             __shared_ptr_access<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_1e8->dofh);
    std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>::
    function<main::__0&,void>
              ((function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)> *)
               &local_620,&local_270);
    std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>::
    function<main::__1&,void>
              ((function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)> *)&local_640,
               &local_271);
    RVar1 = lf::base::RefEl::kTria();
    lf::quad::make_QuadRule(&local_670,RVar1,10);
    projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow
              (&local_600,&pvVar6->mesh,peVar3,&local_620,&local_640,1.0,&local_670,true);
    lf::quad::QuadRule::~QuadRule(&local_670);
    std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)>::~function
              (&local_640);
    std::
    function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>::
    ~function(&local_620);
    p_Var4 = std::get<0ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>>
                       (&local_600);
    pMVar5 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             std::get<1ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>>
                       (&local_600);
    lf::assemble::COOMatrix<double>::makeSparse
              ((SparseMatrix<double,_0,_int> *)&solver_modified.m_detPermC,p_Var4);
    Eigen::SparseMatrix<double,_0,_int>::operator=
              (&local_1e8->A_modified,(SparseMatrix<double,_0,_int> *)&solver_modified.m_detPermC);
    Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
              ((SparseMatrix<double,_0,_int> *)&solver_modified.m_detPermC);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               local_918,&local_1e8->A_modified);
    SVar19 = Eigen::
             SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
             ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                         *)local_918,pMVar5);
    analyticU._8_8_ = SVar19.m_dec;
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)&local_1e8->solution_modified,
               (DenseBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&analyticU.field_0x8);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               local_918);
    std::tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~tuple
              (&local_600);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               local_5c0);
    std::tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~tuple
              (&local_2a8);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)&sol);
    lf::io::GmshReader::~GmshReader((GmshReader *)local_1a8);
    std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
              (&local_110);
    std::filesystem::__cxx11::path::~path((path *)local_70);
  }
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:176:7)>
  ::MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:176:7)>
              *)local_938);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:180:7)>
  ::MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:180:7)>
              *)&lvl_1);
  for (fe_space.
       super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._0_4_ = 0;
      (uint)fe_space.
            super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi < 6;
      fe_space.
      super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ =
           (uint)fe_space.
                 super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi + 1) {
    std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
              ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
               (ulong)(uint)fe_space.
                            super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
    std::make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>,std::shared_ptr<lf::mesh::Mesh_const>&>
              ((shared_ptr<const_lf::mesh::Mesh> *)&velocity_exact.f_);
    grad_exact._12_4_ = 3;
    lf::mesh::utils::
    MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:188:9)>
    ::MeshFunctionGlobal
              ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>
                *)local_978,(anon_class_4_1_54a3980e_for_f_)0x3);
    velocity.grad_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows._4_4_ = 3;
    lf::mesh::utils::
    MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:190:9)>
    ::MeshFunctionGlobal
              ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>
                *)local_990,(anon_class_4_1_54a3980e_for_f_)0x3);
    this = &velocity_modified.grad_.dof_vector_.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>::
    shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
              ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const> *)this,
               (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&velocity_exact.f_);
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::
    MeshFunctionVelocity
              ((MeshFunctionVelocity<double,_double> *)local_9b8,
               (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)this,
               &pvVar6->solution);
    std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr
              ((shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
               &velocity_modified.grad_.dof_vector_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    this_00 = &writer.aux_node_offset_._M_elems[1].codim_;
    std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>::
    shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
              ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const> *)this_00,
               (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&velocity_exact.f_);
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::
    MeshFunctionVelocity
              ((MeshFunctionVelocity<double,_double> *)local_9e8,
               (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)this_00,
               &pvVar6->solution_modified);
    std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr
              ((shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)
               &writer.aux_node_offset_._M_elems[1].codim_);
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&local_be0,&pvVar6->mesh);
    concat<char_const(&)[7],unsigned_int&,char_const(&)[5]>
              (&local_c00,(char (*) [7])"result",
               (uint *)&fe_space.
                        super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,(char (*) [5])".vtk");
    lf::io::VtkWriter::VtkWriter((VtkWriter *)local_bd0,&local_be0,&local_c00,0,'\x01');
    std::__cxx11::string::~string((string *)&local_c00);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_be0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c20,"analyticU",&local_c21);
    lf::io::VtkWriter::
    WriteCellData<lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:176:7)>_>
              ((VtkWriter *)local_bd0,&local_c20,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:176:7)>
                *)local_938);
    std::__cxx11::string::~string((string *)&local_c20);
    std::allocator<char>::~allocator(&local_c21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c48,"analyticF",&local_c49);
    lf::io::VtkWriter::
    WriteCellData<lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:180:7)>_>
              ((VtkWriter *)local_bd0,&local_c48,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:180:7)>
                *)&lvl_1);
    std::__cxx11::string::~string((string *)&local_c48);
    std::allocator<char>::~allocator(&local_c49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c70,"U",&local_c71);
    lf::io::VtkWriter::
    WriteCellData<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((VtkWriter *)local_bd0,&local_c70,(MeshFunctionVelocity<double,_double> *)local_9b8);
    std::__cxx11::string::~string((string *)&local_c70);
    std::allocator<char>::~allocator(&local_c71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c98,"U_modified",(allocator<char> *)&diff_v.b_.field_0xf);
    lf::io::VtkWriter::
    WriteCellData<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((VtkWriter *)local_bd0,&local_c98,(MeshFunctionVelocity<double,_double> *)local_9e8);
    std::__cxx11::string::~string((string *)&local_c98);
    std::allocator<char>::~allocator((allocator<char> *)&diff_v.b_.field_0xf);
    lf::mesh::utils::
    operator-<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)&diff_v_modified.b_.f_,(MeshFunctionVelocity<double,_double> *)local_9b8,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>
                *)local_978);
    lf::mesh::utils::
    operator-<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)&diff_grad.mf_.f_,(MeshFunctionVelocity<double,_double> *)local_9e8,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>
                *)local_978);
    lf::mesh::utils::
    operator-<lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
              ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
                *)&diff_grad_modified.mf_.f_,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>
                *)local_990);
    lf::mesh::utils::
    operator-<lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
              ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
                *)local_d40,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>
                *)local_990);
    factor._7_1_ = 0;
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    peVar7 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)pvVar6);
    lf::mesh::utils::
    transpose<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              (&local_dc0,(MeshFunctionVelocity<double,_double> *)local_9b8);
    lf::mesh::utils::
    operator*<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              (&local_d98,&local_dc0,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>
                *)local_978);
    lf::fe::
    IntegrateMeshFunction<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:212:30),_lf::base::PredicateTrue>
              (local_d58,peVar7,&local_d98,(anon_class_1_0_00000001 *)((long)&factor + 7),&local_dc1
               ,0);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1> *)local_d58,0,0);
    dVar11 = *pSVar8;
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    peVar7 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)pvVar6);
    lf::mesh::utils::
    squaredNorm<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              (&local_df0,(MeshFunctionVelocity<double,_double> *)local_9b8);
    MVar10 = lf::fe::
             IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:212:30),_lf::base::PredicateTrue>
                       (peVar7,&local_df0,(anon_class_1_0_00000001 *)((long)&factor + 7),
                        (PredicateTrue *)((long)&factor_modified + 7),0);
    lf::mesh::utils::
    MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
    ::~MeshFunctionUnary(&local_df0);
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:188:9)>_>
    ::~MeshFunctionBinary(&local_d98);
    lf::mesh::utils::
    MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
    ::~MeshFunctionUnary(&local_dc0);
    local_d50 = dVar11 / MVar10;
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    peVar7 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)pvVar6);
    lf::mesh::utils::
    transpose<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              (&local_e70,(MeshFunctionVelocity<double,_double> *)local_9e8);
    lf::mesh::utils::
    operator*<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              (&local_e48,&local_e70,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>
                *)local_978);
    lf::fe::
    IntegrateMeshFunction<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:212:30),_lf::base::PredicateTrue>
              (local_e08,peVar7,&local_e48,(anon_class_1_0_00000001 *)((long)&factor + 7),&local_e71
               ,0);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1> *)local_e08,0,0);
    dVar11 = *pSVar8;
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    peVar7 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)pvVar6);
    lf::mesh::utils::
    squaredNorm<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              (&local_ea0,(MeshFunctionVelocity<double,_double> *)local_9e8);
    MVar10 = lf::fe::
             IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:212:30),_lf::base::PredicateTrue>
                       (peVar7,&local_ea0,(anon_class_1_0_00000001 *)((long)&factor + 7),
                        (PredicateTrue *)
                        ((long)&velocity_scaled.b_.grad_.dof_vector_.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows + 7),0);
    lf::mesh::utils::
    MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
    ::~MeshFunctionUnary(&local_ea0);
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:188:9)>_>
    ::~MeshFunctionBinary(&local_e48);
    lf::mesh::utils::
    MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
    ::~MeshFunctionUnary(&local_e70);
    local_e00 = dVar11 / MVar10;
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,local_d50);
    std::operator<<(poVar9,'\n');
    lf::mesh::utils::MeshFunctionConstant<double>::MeshFunctionConstant
              ((MeshFunctionConstant<double> *)
               &velocity_scaled_modified.b_.grad_.dof_vector_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               local_d50);
    lf::mesh::utils::
    operator*<lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_ed8,
               (MeshFunctionConstant<double> *)
               &velocity_scaled_modified.b_.grad_.dof_vector_.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (MeshFunctionVelocity<double,_double> *)local_9b8);
    lf::mesh::utils::MeshFunctionConstant<double>::MeshFunctionConstant
              ((MeshFunctionConstant<double> *)&diff_v_fac.b_.f_,local_e00);
    lf::mesh::utils::
    operator*<lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_f10,(MeshFunctionConstant<double> *)&diff_v_fac.b_.f_,
               (MeshFunctionVelocity<double,_double> *)local_9e8);
    lf::mesh::utils::
    operator-<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)&diff_v_fac_modified.b_.f_,
               (MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_ed8,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>
                *)local_978);
    lf::mesh::utils::
    operator-<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)&diff_g_fac,
               (MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_f10,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>
                *)local_978);
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    dVar11 = projects::ipdg_stokes::post_processing::
             L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,main::__6>
                       (&pvVar6->mesh,
                        (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                         *)&diff_v_modified.b_.f_,(anon_class_1_0_00000001 *)((long)&factor + 7));
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    dVar12 = projects::ipdg_stokes::post_processing::
             DGnorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,lf::mesh::utils::MeshFunctionGlobal<main::__5>>,main::__6>
                       (&pvVar6->mesh,
                        (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                         *)&diff_v_modified.b_.f_,
                        (MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
                         *)&diff_grad_modified.mf_.f_,(anon_class_1_0_00000001 *)((long)&factor + 7)
                       );
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    dVar13 = projects::ipdg_stokes::post_processing::
             L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,lf::mesh::utils::MeshFunctionConstant<double>,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,main::__6>
                       (&pvVar6->mesh,
                        (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                         *)&diff_v_fac_modified.b_.f_,(anon_class_1_0_00000001 *)((long)&factor + 7)
                       );
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    dVar14 = projects::ipdg_stokes::post_processing::
             DGnorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,lf::mesh::utils::MeshFunctionConstant<double>,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,lf::mesh::utils::MeshFunctionGlobal<main::__5>>,main::__6>
                       (&pvVar6->mesh,
                        (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                         *)&diff_v_fac_modified.b_.f_,
                        (MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
                         *)&diff_grad_modified.mf_.f_,(anon_class_1_0_00000001 *)((long)&factor + 7)
                       );
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    dVar15 = projects::ipdg_stokes::post_processing::
             L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,main::__6>
                       (&pvVar6->mesh,
                        (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                         *)&diff_grad.mf_.f_,(anon_class_1_0_00000001 *)((long)&factor + 7));
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    dVar16 = projects::ipdg_stokes::post_processing::
             DGnorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,lf::mesh::utils::MeshFunctionGlobal<main::__5>>,main::__6>
                       (&pvVar6->mesh,
                        (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                         *)&diff_grad.mf_.f_,
                        (MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
                         *)local_d40,(anon_class_1_0_00000001 *)((long)&factor + 7));
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    dVar17 = projects::ipdg_stokes::post_processing::
             L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,lf::mesh::utils::MeshFunctionConstant<double>,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,main::__6>
                       (&pvVar6->mesh,
                        (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                         *)&diff_g_fac,(anon_class_1_0_00000001 *)((long)&factor + 7));
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    dVar18 = projects::ipdg_stokes::post_processing::
             DGnorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,lf::mesh::utils::MeshFunctionConstant<double>,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,lf::mesh::utils::MeshFunctionGlobal<main::__5>>,main::__6>
                       (&pvVar6->mesh,
                        (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                         *)&diff_g_fac,
                        (MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
                         *)local_d40,(anon_class_1_0_00000001 *)((long)&factor + 7));
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (&std::cout,
                        (uint)fe_space.
                              super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
    poVar9 = std::operator<<(poVar9,' ');
    pvVar6 = std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::operator[]
                       ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30,
                        (ulong)(uint)fe_space.
                                     super___shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
    peVar7 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pvVar6);
    uVar2 = (*peVar7->_vptr_Mesh[3])(peVar7,2);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar2);
    poVar9 = std::operator<<(poVar9,' ');
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar11);
    poVar9 = std::operator<<(poVar9,' ');
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar12);
    poVar9 = std::operator<<(poVar9,' ');
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar13);
    poVar9 = std::operator<<(poVar9,' ');
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar14);
    poVar9 = std::operator<<(poVar9,' ');
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar15);
    poVar9 = std::operator<<(poVar9,' ');
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar16);
    poVar9 = std::operator<<(poVar9,' ');
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar17);
    poVar9 = std::operator<<(poVar9,' ');
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar18);
    std::operator<<(poVar9,'\n');
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:188:9)>_>
    ::~MeshFunctionBinary
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)&diff_g_fac);
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:188:9)>_>
    ::~MeshFunctionBinary
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)&diff_v_fac_modified.b_.f_);
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
    ::~MeshFunctionBinary
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_f10);
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
    ::~MeshFunctionBinary
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_ed8);
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:188:9)>_>
    ::~MeshFunctionBinary
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)&diff_grad.mf_.f_);
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:188:9)>_>
    ::~MeshFunctionBinary
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)&diff_v_modified.b_.f_);
    lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_bd0);
    projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::
    ~MeshFunctionVelocity((MeshFunctionVelocity<double,_double> *)local_9e8);
    projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::
    ~MeshFunctionVelocity((MeshFunctionVelocity<double,_double> *)local_9b8);
    std::shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_>::~shared_ptr
              ((shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&velocity_exact.f_);
  }
  std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::~vector
            ((vector<ProblemSolution,_std::allocator<ProblemSolution>_> *)local_30);
  return 0;
}

Assistant:

int main() {
  const unsigned mesh_count = 6;
  const int n = 3;
  const unsigned quadrule_degree = 10;

  // Compute the solution for each mesh
  std::vector<ProblemSolution> solutions(mesh_count);
  for (lf::base::size_type lvl = 0; lvl < mesh_count; ++lvl) {
    std::filesystem::path meshpath = __FILE__;
    meshpath = meshpath.parent_path() / concat("disk", lvl, ".msh");
    std::unique_ptr<lf::mesh::MeshFactory> factory =
        std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
    lf::io::GmshReader reader(std::move(factory), meshpath.string());
    auto mesh = reader.mesh();
    auto& sol = solutions[lvl];
    sol.mesh = mesh;
    sol.dofh = std::shared_ptr<const lf::assemble::DofHandler>(
        new lf::assemble::UniformFEDofHandler(
            mesh, {{lf::base::RefEl::kPoint(), 1},
                   {lf::base::RefEl::kSegment(), 1}}));
    // Use the volume forces returned by computeF
    auto f = [n](const Eigen::Vector2d& x) -> Eigen::Vector2d {
      return computeF(n, x);
    };
    // The velocity on the boundary is zero everywhere
    auto dirichlet_funct = [](const lf::mesh::Entity&
                              /*unused*/) -> Eigen::Vector2d {
      return Eigen::Vector2d::Zero();
    };
    const auto [A, rhs] =
        projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(
            sol.mesh, *(sol.dofh), f, dirichlet_funct, 1,
            lf::quad::make_QuadRule(lf::base::RefEl::kTria(), quadrule_degree),
            false);
    sol.A = A.makeSparse();
    sol.rhs = rhs;
    Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
    solver.compute(sol.A);
    sol.solution = solver.solve(rhs);
    const auto [A_modified, rhs_modified] =
        projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(
            sol.mesh, *(sol.dofh), f, dirichlet_funct, 1,
            lf::quad::make_QuadRule(lf::base::RefEl::kTria(), quadrule_degree),
            true);
    sol.A_modified = A_modified.makeSparse();
    const Eigen::SparseLU<Eigen::SparseMatrix<double>> solver_modified(
        sol.A_modified);
    sol.solution_modified = solver_modified.solve(rhs_modified);
  }

  // Perform post processing on the data
  const auto analyticU = lf::mesh::utils::MeshFunctionGlobal(
      [&](const Eigen::Vector2d& x) -> Eigen::Vector2d {
        return computeU(n, x);
      });
  const auto analyticF = lf::mesh::utils::MeshFunctionGlobal(
      [&](const Eigen::Vector2d& x) -> Eigen::Vector2d {
        return computeF(n, x);
      });
  for (lf::base::size_type lvl = 0; lvl < mesh_count; ++lvl) {
    const auto fe_space =
        std::make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>>(
            solutions[lvl].mesh);
    const auto velocity_exact = lf::mesh::utils::MeshFunctionGlobal(
        [n](const Eigen::Vector2d& x) { return computeU(n, x); });
    const auto grad_exact = lf::mesh::utils::MeshFunctionGlobal(
        [n](const Eigen::Vector2d& x) -> Eigen::Matrix2d {
          return computeUGrad(n, x);
        });
    const projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,
                                                                       double>
        velocity(fe_space, solutions[lvl].solution);
    const projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,
                                                                       double>
        velocity_modified(fe_space, solutions[lvl].solution_modified);
    lf::io::VtkWriter writer(solutions[lvl].mesh,
                             concat("result", lvl, ".vtk"));
    writer.WriteCellData("analyticU", analyticU);
    writer.WriteCellData("analyticF", analyticF);
    writer.WriteCellData("U", velocity);
    writer.WriteCellData("U_modified", velocity_modified);
    // The error in the velocity
    const auto diff_v = velocity - velocity_exact;
    const auto diff_v_modified = velocity_modified - velocity_exact;
    // The error in the gradient of the velocity
    const auto diff_grad = -grad_exact;
    const auto diff_grad_modified = -grad_exact;
    // Approximately compute the factor the numerical solution is off by
    const auto qr_provider = [](const lf::mesh::Entity& e) {
      return lf::quad::make_QuadRule(e.RefEl(), 0);
    };
    const double factor =
        lf::fe::IntegrateMeshFunction(
            *(solutions[lvl].mesh),
            lf::mesh::utils::transpose(velocity) * velocity_exact,
            qr_provider)(0, 0) /
        lf::fe::IntegrateMeshFunction(*(solutions[lvl].mesh),
                                      lf::mesh::utils::squaredNorm(velocity),
                                      qr_provider);
    const double factor_modified =
        lf::fe::IntegrateMeshFunction(
            *(solutions[lvl].mesh),
            lf::mesh::utils::transpose(velocity_modified) * velocity_exact,
            qr_provider)(0, 0) /
        lf::fe::IntegrateMeshFunction(
            *(solutions[lvl].mesh),
            lf::mesh::utils::squaredNorm(velocity_modified), qr_provider);
    std::cout << factor << '\n';
    // The error in the corrected velocity
    const auto velocity_scaled =
        lf::mesh::utils::MeshFunctionConstant<double>(factor) * velocity;
    const auto velocity_scaled_modified =
        lf::mesh::utils::MeshFunctionConstant(factor_modified) *
        velocity_modified;
    const auto diff_v_fac = velocity_scaled - velocity_exact;
    const auto diff_v_fac_modified = velocity_scaled_modified - velocity_exact;
    // The error in the gradient of the corrected velocty
    const auto& diff_g_fac = diff_grad;
    const auto& diff_g_fac_modified = diff_grad_modified;
    const double L2 = projects::ipdg_stokes::post_processing::L2norm(
        solutions[lvl].mesh, diff_v, qr_provider);
    const double DG = projects::ipdg_stokes::post_processing::DGnorm(
        solutions[lvl].mesh, diff_v, diff_grad, qr_provider);
    const double L2f = projects::ipdg_stokes::post_processing::L2norm(
        solutions[lvl].mesh, diff_v_fac, qr_provider);
    const double DGf = projects::ipdg_stokes::post_processing::DGnorm(
        solutions[lvl].mesh, diff_v_fac, diff_g_fac, qr_provider);
    const double L2_modified = projects::ipdg_stokes::post_processing::L2norm(
        solutions[lvl].mesh, diff_v_modified, qr_provider);
    const double DG_modified = projects::ipdg_stokes::post_processing::DGnorm(
        solutions[lvl].mesh, diff_v_modified, diff_grad_modified, qr_provider);
    const double L2f_modified = projects::ipdg_stokes::post_processing::L2norm(
        solutions[lvl].mesh, diff_v_fac_modified, qr_provider);
    const double DGf_modified = projects::ipdg_stokes::post_processing::DGnorm(
        solutions[lvl].mesh, diff_v_fac_modified, diff_g_fac_modified,
        qr_provider);
    std::cout << lvl << ' ' << solutions[lvl].mesh->NumEntities(2) << ' ' << L2
              << ' ' << DG << ' ' << L2f << ' ' << DGf << ' ' << L2_modified
              << ' ' << DG_modified << ' ' << L2f_modified << ' '
              << DGf_modified << '\n';
  }
}